

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::Truncate
          (RepeatedField<google::protobuf::UnknownField> *this,int new_size)

{
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar1;
  UnknownField *pUVar2;
  UnknownField *elem;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  byte local_15;
  int old_size;
  bool is_soo;
  RepeatedField<google::protobuf::UnknownField> *pRStack_10;
  int new_size_local;
  RepeatedField<google::protobuf::UnknownField> *this_local;
  
  old_size = new_size;
  pRStack_10 = this;
  local_15 = RepeatedField<google::protobuf::UnknownField>::is_soo(this);
  absl_log_internal_check_op_result._4_4_ = size(this,(bool)local_15);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(old_size);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue
                 (absl_log_internal_check_op_result._4_4_);
  local_28 = absl::lts_20250127::log_internal::Check_LEImpl(v1,v2,"new_size <= old_size");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&elem,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ed,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&elem);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&elem);
  }
  if (old_size < absl_log_internal_check_op_result._4_4_) {
    pUVar2 = unsafe_elements(this,(bool)(local_15 & 1));
    Destroy(pUVar2 + old_size,pUVar2 + absl_log_internal_check_op_result._4_4_);
    ExchangeCurrentSize(this,(bool)(local_15 & 1),old_size);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Truncate(int new_size) {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_LE(new_size, old_size);
  if (new_size < old_size) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem + new_size, elem + old_size);
    ExchangeCurrentSize(is_soo, new_size);
  }
}